

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RingDecomposerLib.c
# Opt level: O2

double RDL_getNofRC(RDL_data *data)

{
  uint index;
  double dVar1;
  double dVar2;
  
  if (data == (RDL_data *)0x0) {
    (*RDL_outputFunc)(RDL_ERROR,"RDL_data is NULL!\n");
LAB_001045b1:
    dVar1 = 1.79769313486232e+308;
  }
  else {
    dVar1 = 0.0;
    for (index = 0; index < data->nofURFs; index = index + 1) {
      dVar2 = RDL_getNofRCForURF(data,index);
      if ((dVar2 == 1.79769313486232e+308) && (!NAN(dVar2))) goto LAB_001045b1;
      dVar1 = dVar1 + dVar2;
    }
  }
  return dVar1;
}

Assistant:

double RDL_getNofRC(const RDL_data *data)
{
  double result = 0, intermediate;
  unsigned i;

  if (!data) {
    RDL_outputFunc(RDL_ERROR, "RDL_data is NULL!\n");
    return RDL_INVALID_RC_COUNT;
  }

  /* add up results for URFs */
  for (i = 0; i < data->nofURFs; ++i) {
    intermediate = RDL_getNofRCForURF(data, i);
    if (intermediate == RDL_INVALID_RC_COUNT) {
      return RDL_INVALID_RC_COUNT;
    }

    result += intermediate;
  }

  return result;
}